

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  _func_int **pp_Var1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  CallContextHook *in_RDX;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Client cap;
  Reader params;
  Client local_d0;
  code *local_c0;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  local_b8;
  OwnPromiseNode local_b0;
  undefined *local_a8;
  undefined *puStack_a0;
  undefined8 local_98;
  undefined1 local_90 [24];
  CallFooWhenResolvedContext local_78;
  undefined1 local_70 [24];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  Reader local_50;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_b8.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  ::getParams(&local_50,&local_b8);
  capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams::Reader::getCap
            ((Client *)local_70,&local_50);
  Capability::Client::whenResolved(&local_d0);
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_90,(Client *)local_70);
  local_78.hook = local_b8.hook;
  local_c0 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1079:34)>
             ::anon_class_32_2_dc087ca5_for_func::operator();
  pp_Var1 = local_d0.hook.disposer[1]._vptr_Disposer;
  if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_d0.hook.disposer - (long)pp_Var1) < 0x40)
  {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
                   *)((long)pvVar3 + 0x3c0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d0,
               (anon_class_32_2_dc087ca5_for_func *)local_90,&local_c0);
    *(void **)((long)pvVar3 + 0x3c8) = pvVar3;
  }
  else {
    local_d0.hook.disposer[1]._vptr_Disposer = (_func_int **)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
                   *)(local_d0.hook.disposer + -8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d0,
               (anon_class_32_2_dc087ca5_for_func *)local_90,&local_c0);
    local_d0.hook.disposer[-7]._vptr_Disposer = pp_Var1;
  }
  local_a8 = &DAT_0028d57f;
  puStack_a0 = &DAT_0028d5de;
  local_98 = 0x4c0000058b;
  location.function = &DAT_0028d5de;
  location.fileName = &DAT_0028d57f;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_d0.hook.ptr = (ClientHook *)location_00;
  kj::_::maybeChain<void>(&local_b0,(Promise<void> *)&local_d0.hook.ptr,location);
  OVar2.ptr = local_b0.ptr;
  local_b0.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b0);
  *(PromiseNode **)&this->super_Server = OVar2.ptr;
  local_58.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d0.hook.ptr);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_90 + 8));
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_70 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }